

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_union_impl(t_rs_generator *this,string *union_name,t_struct *tstruct)

{
  ostream *poVar1;
  t_struct *tstruct_local;
  string *union_name_local;
  t_rs_generator *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"impl ");
  poVar1 = std::operator<<(poVar1,(string *)union_name);
  poVar1 = std::operator<<(poVar1," {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up(&this->super_t_generator);
  render_union_sync_read(this,union_name,tstruct);
  render_union_sync_write(this,union_name,tstruct);
  t_generator::indent_down(&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_gen_,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)&this->f_gen_,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_union_impl(const string& union_name, t_struct* tstruct) {
  f_gen_ << "impl " << union_name << " {" << endl;
  indent_up();

  render_union_sync_read(union_name, tstruct);
  render_union_sync_write(union_name, tstruct);

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}